

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

Gia_Obj_t * Gia_ManAppendObj(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  uint *local_28;
  Gia_Obj_t *local_20;
  int nObjNew;
  Gia_Man_t *p_local;
  
  if (p->nObjs == p->nObjsAlloc) {
    uVar1 = Abc_MinInt(p->nObjsAlloc << 1,0x20000000);
    if (p->nObjs == 0x20000000) {
      printf("Hard limit on the number of nodes (2^29) is reached. Quitting...\n");
      exit(1);
    }
    if ((int)uVar1 <= p->nObjs) {
      __assert_fail("p->nObjs < nObjNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x288,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    if (p->fVerbose != 0) {
      printf("Extending GIA object storage: %d -> %d.\n",(ulong)(uint)p->nObjsAlloc,(ulong)uVar1);
    }
    if (p->nObjsAlloc < 1) {
      __assert_fail("p->nObjsAlloc > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x28b,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    if (p->pObjs == (Gia_Obj_t *)0x0) {
      local_20 = (Gia_Obj_t *)malloc((long)(int)uVar1 * 0xc);
    }
    else {
      local_20 = (Gia_Obj_t *)realloc(p->pObjs,(long)(int)uVar1 * 0xc);
    }
    p->pObjs = local_20;
    memset(p->pObjs + p->nObjsAlloc,0,(long)(int)(uVar1 - p->nObjsAlloc) * 0xc);
    if (p->pMuxes != (uint *)0x0) {
      if (p->pMuxes == (uint *)0x0) {
        local_28 = (uint *)malloc((long)(int)uVar1 << 2);
      }
      else {
        local_28 = (uint *)realloc(p->pMuxes,(long)(int)uVar1 << 2);
      }
      p->pMuxes = local_28;
      memset(p->pMuxes + p->nObjsAlloc,0,(long)(int)(uVar1 - p->nObjsAlloc) << 2);
    }
    p->nObjsAlloc = uVar1;
  }
  iVar2 = Vec_IntSize(&p->vHTable);
  if (iVar2 != 0) {
    Vec_IntPush(&p->vHash,0);
  }
  iVar2 = p->nObjs;
  p->nObjs = iVar2 + 1;
  pGVar3 = Gia_ManObj(p,iVar2);
  return pGVar3;
}

Assistant:

static inline Gia_Obj_t * Gia_ManAppendObj( Gia_Man_t * p )  
{ 
    if ( p->nObjs == p->nObjsAlloc )
    {
        int nObjNew = Abc_MinInt( 2 * p->nObjsAlloc, (1 << 29) );
        if ( p->nObjs == (1 << 29) )
            printf( "Hard limit on the number of nodes (2^29) is reached. Quitting...\n" ), exit(1);
        assert( p->nObjs < nObjNew );
        if ( p->fVerbose )
            printf("Extending GIA object storage: %d -> %d.\n", p->nObjsAlloc, nObjNew );
        assert( p->nObjsAlloc > 0 );
        p->pObjs = ABC_REALLOC( Gia_Obj_t, p->pObjs, nObjNew );
        memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Gia_Obj_t) * (nObjNew - p->nObjsAlloc) );
        if ( p->pMuxes )
        {
            p->pMuxes = ABC_REALLOC( unsigned, p->pMuxes, nObjNew );
            memset( p->pMuxes + p->nObjsAlloc, 0, sizeof(unsigned) * (nObjNew - p->nObjsAlloc) );
        }
        p->nObjsAlloc = nObjNew;
    }
    if ( Vec_IntSize(&p->vHTable) ) Vec_IntPush( &p->vHash, 0 );
    return Gia_ManObj( p, p->nObjs++ );
}